

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O2

UBool __thiscall
icu_63::CollationSettings::operator==(CollationSettings *this,CollationSettings *other)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((this->options != other->options) ||
     (((this->options & 0xcU) != 0 && (this->variableTop != other->variableTop)))) {
    return '\0';
  }
  uVar1 = this->reorderCodesLength;
  uVar3 = 0;
  if (uVar1 == other->reorderCodesLength) {
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    do {
      uVar2 = uVar3;
      if (uVar4 == uVar2) break;
      uVar3 = uVar2 + 1;
    } while (this->reorderCodes[uVar2] == other->reorderCodes[uVar2]);
    uVar3 = (ulong)((long)(int)uVar1 <= (long)uVar2);
  }
  return (UBool)uVar3;
}

Assistant:

UBool
CollationSettings::operator==(const CollationSettings &other) const {
    if(options != other.options) { return FALSE; }
    if((options & ALTERNATE_MASK) != 0 && variableTop != other.variableTop) { return FALSE; }
    if(reorderCodesLength != other.reorderCodesLength) { return FALSE; }
    for(int32_t i = 0; i < reorderCodesLength; ++i) {
        if(reorderCodes[i] != other.reorderCodes[i]) { return FALSE; }
    }
    return TRUE;
}